

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

void next_entry(quicly_sentmap_iter_t *iter)

{
  long lVar1;
  long *plVar2;
  long *in_RDI;
  
  lVar1 = in_RDI[1];
  in_RDI[1] = lVar1 + -1;
  if (lVar1 + -1 == 0) {
    plVar2 = *(long **)in_RDI[2];
    in_RDI[2] = (long)plVar2;
    if (*plVar2 == 0) {
      *in_RDI = (long)&quicly_sentmap__end_iter;
      in_RDI[1] = 0;
      return;
    }
    if (*(long *)(*(long *)in_RDI[2] + 8) == 0) {
      __assert_fail("(*iter->ref)->num_entries != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                    ,0x26,"void next_entry(quicly_sentmap_iter_t *)");
    }
    in_RDI[1] = *(long *)(*(long *)in_RDI[2] + 8);
    *in_RDI = *(long *)in_RDI[2] + 0x18;
  }
  else {
    *in_RDI = *in_RDI + 0x20;
  }
  while (*(long *)*in_RDI == 0) {
    *in_RDI = *in_RDI + 0x20;
  }
  return;
}

Assistant:

static void next_entry(quicly_sentmap_iter_t *iter)
{
    if (--iter->count != 0) {
        ++iter->p;
    } else if (*(iter->ref = &(*iter->ref)->next) == NULL) {
        iter->p = (quicly_sent_t *)&quicly_sentmap__end_iter;
        iter->count = 0;
        return;
    } else {
        assert((*iter->ref)->num_entries != 0);
        iter->count = (*iter->ref)->num_entries;
        iter->p = (*iter->ref)->entries;
    }
    while (iter->p->acked == NULL)
        ++iter->p;
}